

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> qclab::dense::eye<std::complex<double>>(int64_t size)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> _Var3;
  int64_t in_RSI;
  SquareMatrix<std::complex<double>_> SVar4;
  complex<double> value;
  __uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
  extraout_RDX;
  
  value._M_value._8_8_ = in_RCX;
  value._M_value._0_8_ = in_RDX;
  SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)size,in_RSI,value);
  _Var3._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       extraout_RDX.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  if (0 < in_RSI) {
    lVar2 = 0;
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
           (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
           (lVar2 * 0x10);
      puVar1 = (undefined8 *)
               ((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
               *(long *)size * lVar2 * 0x10 + *(long *)(size + 8));
      *puVar1 = 0x3ff0000000000000;
      puVar1[1] = 0;
      lVar2 = lVar2 + 1;
    } while (in_RSI != lVar2);
  }
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )_Var3._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar4.size_ = size;
  return SVar4;
}

Assistant:

SquareMatrix< T > eye( const int64_t size ) {
      SquareMatrix< T > mat( size , T(0) ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < size; i++ ) {
        mat(i,i) = T(1) ;
      }
      return mat ;
    }